

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O2

void __thiscall sfm::FeatureSet::compute_surf(FeatureSet *this,ConstPtr *image)

{
  pointer *this_00;
  pointer pDVar1;
  pointer pDVar2;
  pointer pDVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined1 local_d0 [8];
  Surf surf;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  ConstPtr *local_60;
  vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *local_58;
  FeatureSet *local_50;
  undefined1 auStack_48 [8];
  Descriptors descr;
  
  auStack_48 = (undefined1  [8])0x0;
  descr.super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descr.super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  features::Surf::Surf((Surf *)local_d0,&(this->opts).surf_opts);
  this_00 = &surf.descriptors.
             super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             &image->
              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
  features::Surf::set_image((Surf *)local_d0,(ConstPtr *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  features::Surf::process((Surf *)local_d0);
  std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::operator=
            ((vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_> *)
             auStack_48,
             (vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_> *)
             &surf.keypoints.
              super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_60 = image;
  features::Surf::~Surf((Surf *)local_d0);
  std::
  __sort<__gnu_cxx::__normal_iterator<features::Surf::Descriptor*,std::vector<features::Surf::Descriptor,std::allocator<features::Surf::Descriptor>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(features::Surf::Descriptor_const&,features::Surf::Descriptor_const&)>>
            ((__normal_iterator<features::Surf::Descriptor_*,_std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>_>
              )auStack_48,
             (__normal_iterator<features::Surf::Descriptor_*,_std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>_>
              )descr.
               super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (_Iter_comp_iter<bool_(*)(const_features::Surf::Descriptor_&,_const_features::Surf::Descriptor_&)>
              )0x10a48f);
  local_58 = &this->positions;
  lVar4 = (long)(this->positions).
                super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->positions).
                super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::resize
            (local_58,((long)descr.
                             super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) / 0x110 +
                      lVar4);
  std::vector<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>::
  resize(&this->colors,
         ((long)descr.
                super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) / 0x110 + lVar4);
  lVar5 = lVar4 * 3;
  lVar6 = 4;
  uVar7 = 0;
  local_50 = this;
  while( true ) {
    if ((ulong)(((long)descr.
                       super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) / 0x110) <=
        uVar7) break;
    *(undefined8 *)
     (local_58->super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
     )._M_impl.super__Vector_impl_data._M_start[lVar4 + uVar7].v =
         *(undefined8 *)((long)((Vector<float,_64> *)((long)auStack_48 + 0x10))->v + lVar6 + -0x14);
    core::Image<unsigned_char>::linear_at
              ((local_60->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,*(float *)((long)((Vector<float,_64> *)((long)auStack_48 + 0x10))->v +
                                lVar6 + -0x14),
               *(float *)((long)((Vector<float,_64> *)((long)auStack_48 + 0x10))->v + lVar6 + -0x10)
               ,((this->colors).
                 super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->v + lVar5);
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x110;
    lVar5 = lVar5 + 3;
  }
  pDVar1 = (local_50->surf_descriptors).
           super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (local_50->surf_descriptors).
           super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar3 = (local_50->surf_descriptors).
           super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_50->surf_descriptors).
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_48;
  (local_50->surf_descriptors).
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       descr.
       super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (local_50->surf_descriptors).
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       descr.
       super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  auStack_48 = (undefined1  [8])pDVar1;
  descr.super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = pDVar2;
  descr.super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = pDVar3;
  std::_Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::
  ~_Vector_base((_Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                 *)auStack_48);
  return;
}

Assistant:

void
FeatureSet::compute_surf (core::ByteImage::ConstPtr image)
{
    /* Compute features. */
    Surf::Descriptors descr;
    {
        Surf surf(this->opts.surf_opts);
        surf.set_image(image);
        surf.process();
        descr = surf.get_descriptors();
    }

    /* Sort features by scale for low-res matching. */
    std::sort(descr.begin(), descr.end(), compare_scale<sfm::Surf::Descriptor>);

    /* Prepare and copy to data structures. */
    std::size_t offset = this->positions.size();
    this->positions.resize(offset + descr.size());
    this->colors.resize(offset + descr.size());

    for (std::size_t i = 0; i < descr.size(); ++i)
    {
        Surf::Descriptor const& d = descr[i];
        this->positions[offset + i] = math::Vec2f(d.x, d.y);
        image->linear_at(d.x, d.y, this->colors[offset + i].begin());
    }

    /* Keep SURF descriptors. */
    std::swap(descr, this->surf_descriptors);
}